

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  bool bVar1;
  Content *pCVar2;
  NullableValue<capnp::schema::Node::Reader> *other;
  Reader *pRVar3;
  Vector<capnp::compiler::Compiler::Node_*> *this_00;
  Node **ppNVar4;
  AliasMap *this_01;
  Alias *this_02;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_1b8;
  reference local_148;
  pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> *child_1;
  iterator __end4_1;
  iterator __begin4_1;
  AliasMap *__range4_1;
  Node **child;
  Node **__end4;
  Node **__begin4;
  Vector<capnp::compiler::Compiler::Node_*> *__range4;
  Content *local_100;
  Content *content_1;
  Node *p;
  Reader *aux;
  Reader *__end5;
  Reader *__begin5;
  Array<capnp::schema::Node::Reader> *__range5;
  uint newEagerness;
  Maybe<capnp::schema::Node::Reader> local_c0;
  undefined1 local_88 [8];
  NullableValue<capnp::schema::Node::Reader> schema;
  Content *content;
  mapped_type *local_38;
  uint *slot;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  Node *pNStack_10;
  uint eagerness_local;
  Node *this_local;
  
  content = (Content *)this;
  slot = (uint *)sourceInfo;
  sourceInfo_local = (Vector<capnp::schema::Node::SourceInfo::Reader> *)finalLoader;
  finalLoader_local = (SchemaLoader *)seen;
  seen_local._4_4_ = eagerness;
  pNStack_10 = this;
  local_38 = std::
             unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
             ::operator[](seen,(key_type *)&content);
  if ((*local_38 & seen_local._4_4_) != seen_local._4_4_) {
    *local_38 = seen_local._4_4_ | *local_38;
    schema.field_1._40_8_ = getContent(this,FINISHED);
    pCVar2 = kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                       ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)
                        &schema.field_1.value._reader.nestingLimit);
    if (pCVar2 != (Content *)0x0) {
      loadFinalSchema(this,(SchemaLoader *)sourceInfo_local);
      getFinalSchema(&local_c0,this);
      other = kj::_::readMaybe<capnp::schema::Node::Reader>(&local_c0);
      kj::_::NullableValue<capnp::schema::Node::Reader>::NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_88,other);
      kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_c0);
      pRVar3 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_88);
      if ((pRVar3 != (Reader *)0x0) && (seen_local._4_4_ >> 0xf != 0)) {
        __range5._0_4_ = seen_local._4_4_ & 0xffff8000 | seen_local._4_4_ >> 0xf;
        pRVar3 = kj::_::NullableValue<capnp::schema::Node::Reader>::operator*
                           ((NullableValue<capnp::schema::Node::Reader> *)local_88);
        traverseNodeDependencies
                  (this,pRVar3,(uint)__range5,
                   (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                    *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                   (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        __begin5 = (Reader *)&pCVar2->auxSchemas;
        __end5 = kj::Array<capnp::schema::Node::Reader>::begin
                           ((Array<capnp::schema::Node::Reader> *)__begin5);
        aux = kj::Array<capnp::schema::Node::Reader>::end
                        ((Array<capnp::schema::Node::Reader> *)__begin5);
        for (; __end5 != aux; __end5 = __end5 + 1) {
          p = (Node *)__end5;
          traverseNodeDependencies
                    (this,__end5,(uint)__range5,
                     (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                      *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                     (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        }
      }
      kj::_::NullableValue<capnp::schema::Node::Reader>::~NullableValue
                ((NullableValue<capnp::schema::Node::Reader> *)local_88);
      kj::Vector<capnp::schema::Node::SourceInfo::Reader>::
      addAll<kj::Array<capnp::schema::Node::SourceInfo::Reader>&>
                ((Vector<capnp::schema::Node::SourceInfo::Reader> *)slot,&pCVar2->sourceInfo);
    }
    if (((seen_local._4_4_ & 2) != 0) &&
       (content_1 = (Content *)kj::_::readMaybe<capnp::compiler::Compiler::Node>(&this->parent),
       (Node *)content_1 != (Node *)0x0)) {
      traverse((Node *)content_1,seen_local._4_4_,
               (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
               (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
    }
    if ((seen_local._4_4_ & 4) != 0) {
      __range4 = (Vector<capnp::compiler::Compiler::Node_*> *)getContent(this,EXPANDED);
      local_100 = kj::_::readMaybe<capnp::compiler::Compiler::Node::Content>
                            ((Maybe<capnp::compiler::Compiler::Node::Content_&> *)&__range4);
      if (local_100 != (Content *)0x0) {
        this_00 = &local_100->orderedNestedNodes;
        __end4 = kj::Vector<capnp::compiler::Compiler::Node_*>::begin(this_00);
        ppNVar4 = kj::Vector<capnp::compiler::Compiler::Node_*>::end(this_00);
        for (; __end4 != ppNVar4; __end4 = __end4 + 1) {
          traverse(*__end4,seen_local._4_4_,
                   (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
                    *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
                   (Vector<capnp::schema::Node::SourceInfo::Reader> *)slot);
        }
        this_01 = &local_100->aliases;
        __end4_1 = std::
                   multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
                   ::begin(this_01);
        child_1 = (pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> *)
                  std::
                  multimap<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>_>
                  ::end(this_01);
        while (bVar1 = std::operator!=(&__end4_1,(_Self *)&child_1), bVar1) {
          local_148 = std::
                      _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>
                      ::operator*(&__end4_1);
          this_02 = kj::Own<capnp::compiler::Compiler::Alias>::operator->(&local_148->second);
          Alias::compile(&local_1b8,this_02);
          kj::
          Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
          ::~Maybe(&local_1b8);
          std::
          _Rb_tree_iterator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_>_>
          ::operator++(&__end4_1);
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_MAYBE(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(*schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content->auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content->sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_MAYBE(p, parent) {
      p->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
      for (auto& child: content->orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content->aliases) {
        child.second->compile();
      }
    }
  }
}